

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmatrix.c
# Opt level: O1

void Q_Destr(QMatrix *Q)

{
  ulong uVar1;
  ulong uVar2;
  
  if (Q->Name != (char *)0x0) {
    free(Q->Name);
  }
  if (Q->OwnData != False) {
    if ((Q->Len != (size_t *)0x0) && (uVar1 = Q->Dim, uVar1 != 0 && Q->El != (ElType **)0x0)) {
      uVar2 = 1;
      do {
        if ((Q->Len[uVar2] != 0) && (Q->El[uVar2] != (ElType *)0x0)) {
          free(Q->El[uVar2]);
        }
        uVar2 = uVar2 + 1;
      } while (uVar2 <= uVar1);
    }
    if (Q->Len != (size_t *)0x0) {
      free(Q->Len);
      Q->Len = (size_t *)0x0;
    }
    if (Q->El != (ElType **)0x0) {
      free(Q->El);
      Q->El = (ElType **)0x0;
    }
    if (Q->ElSorted != (Boolean *)0x0) {
      free(Q->ElSorted);
      Q->ElSorted = (Boolean *)0x0;
    }
    if (Q->DiagElAlloc != (Boolean *)0x0) {
      free(Q->DiagElAlloc);
      Q->DiagElAlloc = (Boolean *)0x0;
    }
    if (Q->DiagEl != (ElType **)0x0) {
      free(Q->DiagEl);
      Q->DiagEl = (ElType **)0x0;
    }
    if (Q->ZeroInDiag != (Boolean *)0x0) {
      free(Q->ZeroInDiag);
      Q->ZeroInDiag = (Boolean *)0x0;
    }
    if (Q->InvDiagEl != (Real *)0x0) {
      free(Q->InvDiagEl);
      Q->InvDiagEl = (Real *)0x0;
    }
    if (((Q->ILUExists != (Boolean *)0x0) && (Q->ILU != (QMatrix *)0x0)) && (*Q->ILUExists != False)
       ) {
      Q_Destr(Q->ILU);
    }
    if (Q->ILUExists != (Boolean *)0x0) {
      free(Q->ILUExists);
      Q->ILUExists = (Boolean *)0x0;
    }
    if (Q->ILU != (QMatrixType *)0x0) {
      free(Q->ILU);
      Q->ILU = (QMatrixType *)0x0;
    }
  }
  if (Q->RightKerCmp != (Real *)0x0) {
    free(Q->RightKerCmp);
    Q->RightKerCmp = (Real *)0x0;
  }
  if (Q->LeftKerCmp != (Real *)0x0) {
    free(Q->LeftKerCmp);
    Q->LeftKerCmp = (Real *)0x0;
  }
  if (Q->EigenvalInfo != (void *)0x0) {
    free(Q->EigenvalInfo);
    Q->EigenvalInfo = (void *)0x0;
  }
  return;
}

Assistant:

void Q_Destr(QMatrix *Q)
/* destructor of the type QMatrix */
{
    size_t Dim, RoC;

    if (Q->Name != NULL)
        free(Q->Name);
    Dim = Q->Dim;
    if (Q->OwnData) {
	if (Q->Len != NULL && Q->El != NULL) {
            for (RoC = 1; RoC <= Dim; RoC++) {
                if (Q->Len[RoC] > 0) {
                    if (Q->El[RoC] != NULL)
                        free(Q->El[RoC]);
                }
            }
        }
        if (Q->Len != NULL) {
            free(Q->Len);
            Q->Len = NULL;
        }
        if (Q->El != NULL) {
            free(Q->El);
            Q->El = NULL;
        }
        if (Q->ElSorted != NULL) {
            free(Q->ElSorted);
            Q->ElSorted = NULL;
        }
        if (Q->DiagElAlloc != NULL) {
            free(Q->DiagElAlloc);
            Q->DiagElAlloc = NULL;
        }
        if (Q->DiagEl != NULL) {
            free(Q->DiagEl);
            Q->DiagEl = NULL;
        }
        if (Q->ZeroInDiag != NULL) {
            free(Q->ZeroInDiag);
            Q->ZeroInDiag = NULL;
        }
        if (Q->InvDiagEl != NULL) {
            free(Q->InvDiagEl);
            Q->InvDiagEl = NULL;
        }
        if (Q->ILUExists != NULL && Q->ILU != NULL) {
            if (*Q->ILUExists) 
                Q_Destr(Q->ILU);
        }
        if (Q->ILUExists != NULL) {
            free(Q->ILUExists);
            Q->ILUExists = NULL;
        }
        if (Q->ILU != NULL) {
            free(Q->ILU);
            Q->ILU = NULL;
        }
    }
    if (Q->RightKerCmp != NULL) {
        free(Q->RightKerCmp);
        Q->RightKerCmp = NULL;
    }
    if (Q->LeftKerCmp != NULL) {
        free(Q->LeftKerCmp);
        Q->LeftKerCmp = NULL;
    }
    if (Q->EigenvalInfo != NULL) {
        free(Q->EigenvalInfo);
        Q->EigenvalInfo = NULL;
    }
}